

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
CDT::predict(vector<double,_std::allocator<double>_> *__return_storage_ptr__,CDT *this,
            Matrix<double> *input_matrix)

{
  uint uVar1;
  Shape SVar2;
  vector<double,_std::allocator<double>_> local_78;
  double local_60;
  undefined8 local_58;
  undefined1 local_50;
  undefined8 local_34;
  undefined1 local_2c;
  uint local_28;
  undefined1 local_21;
  uint i;
  Matrix<double> *input_matrix_local;
  CDT *this_local;
  vector<double,_std::allocator<double>_> *results;
  
  local_21 = 0;
  _i = input_matrix;
  input_matrix_local = (Matrix<double> *)this;
  this_local = (CDT *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  local_28 = 0;
  while( true ) {
    uVar1 = local_28;
    SVar2 = Matrix<double>::shape(_i);
    local_58 = SVar2._0_8_;
    local_50 = SVar2.is_diogonal;
    local_34._0_4_ = SVar2.n_row;
    if ((uint)local_34 <= uVar1) break;
    local_34 = local_58;
    local_2c = local_50;
    Matrix<double>::get(&local_78,_i,local_28);
    local_60 = predict(this,&local_78);
    std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_60);
    std::vector<double,_std::allocator<double>_>::~vector(&local_78);
    local_28 = local_28 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> CDT::predict(const Matrix_d& input_matrix) const{
    std::vector<double> results;
    for(unsigned i=0;i<input_matrix.shape().n_row;++i)
        results.push_back(predict(input_matrix.get(i)));
    return results;
}